

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_2,_2>,_tcu::Matrix<double,_2,_2>_>::call
          (unary<tcu::Matrix<double,_2,_2>,_tcu::Matrix<double,_2,_2>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  GLdouble *data_1;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_38 = *argument_src;
  uStack_30 = *(undefined8 *)((long)argument_src + 8);
  local_28 = *(undefined4 *)((long)argument_src + 0x10);
  uStack_24 = *(undefined4 *)((long)argument_src + 0x14);
  uStack_20 = *(undefined4 *)((long)argument_src + 0x18);
  uStack_1c = *(undefined4 *)((long)argument_src + 0x1c);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_58);
  *(undefined8 *)result_dst = local_58;
  *(undefined8 *)((long)result_dst + 8) = uStack_50;
  *(undefined8 *)((long)result_dst + 0x10) = local_48;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_40;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}